

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImageLoaderBMP.cpp
# Opt level: O3

void __thiscall
irr::video::CImageLoaderBMP::decompress8BitRLE
          (CImageLoaderBMP *this,u8 **bmpData,s32 size,s32 width,s32 height,s32 pitch)

{
  byte bVar1;
  byte *pbVar2;
  uint uVar3;
  u8 *puVar4;
  uint uVar5;
  ulong __n;
  int iVar6;
  long lVar7;
  int iVar8;
  uintptr_t baseI_1;
  byte *pbVar9;
  byte *pbVar10;
  uintptr_t baseI;
  u8 *__s;
  uintptr_t endI_1;
  byte *pbVar11;
  uintptr_t endI;
  u8 *puVar12;
  bool bVar13;
  
  pbVar9 = *bmpData;
  iVar6 = width + pitch;
  iVar8 = height * iVar6;
  puVar4 = (u8 *)operator_new__((long)iVar8);
  if (0 < iVar8 && 0 < size) {
    pbVar11 = pbVar9 + size;
    puVar12 = puVar4 + iVar8;
    iVar8 = 0;
    __s = puVar4;
    do {
      bVar1 = *pbVar9;
      __n = (ulong)bVar1;
      pbVar10 = pbVar9 + 1;
      bVar13 = (ulong)((long)pbVar11 - (long)pbVar10) < 2 || pbVar11 < pbVar10;
      if (__n == 0) {
        if (bVar13) goto LAB_001ff371;
        if (*pbVar10 == 0) {
          pbVar9 = pbVar9 + 2;
          iVar8 = iVar8 + 1;
          __s = puVar4 + iVar8 * iVar6;
        }
        else {
          uVar3 = (uint)*pbVar10;
          if (uVar3 == 2) {
            if ((pbVar11 < pbVar9 + 2) || ((ulong)((long)pbVar11 - (long)(pbVar9 + 2)) < 3))
            goto LAB_001ff371;
            __s = __s + (ulong)pbVar9[3] * (long)iVar6 + (ulong)pbVar9[2];
            pbVar9 = pbVar9 + 4;
          }
          else {
            if (uVar3 == 1) goto LAB_001ff371;
            pbVar10 = pbVar9 + 2;
            if (((pbVar11 < pbVar10) || ((ulong)((long)pbVar11 - (long)pbVar10) <= (ulong)uVar3)) ||
               ((ulong)((long)puVar12 - (long)__s) <= (ulong)uVar3)) goto LAB_001ff371;
            lVar7 = 0;
            pbVar2 = pbVar10;
            do {
              pbVar9 = pbVar2;
              __s[lVar7] = pbVar10[lVar7];
              lVar7 = lVar7 + 1;
              pbVar2 = pbVar9 + 1;
            } while (uVar3 != (uint)lVar7);
            if ((pbVar11 < pbVar10 + lVar7) ||
               ((ulong)(((long)pbVar11 - (long)pbVar10) - lVar7) <= (ulong)(uVar3 & 1)))
            goto LAB_001ff371;
            __s = __s + lVar7;
            uVar5 = 0;
            do {
              pbVar9 = pbVar9 + 1;
              bVar13 = uVar5 < (uVar3 & 1);
              uVar5 = 1;
            } while (bVar13);
          }
        }
      }
      else {
        if ((bVar13) || ((ulong)((long)puVar12 - (long)__s) <= __n)) goto LAB_001ff371;
        pbVar10 = pbVar9 + 1;
        pbVar9 = pbVar9 + 2;
        memset(__s,(uint)*pbVar10,__n);
        __s = __s + (ulong)(bVar1 - 1) + 1;
      }
      if ((pbVar11 <= pbVar9) || (puVar12 <= __s)) goto LAB_001ff371;
    } while( true );
  }
LAB_001ff37e:
  if (pbVar9 != (byte *)0x0) {
    operator_delete__(pbVar9);
  }
  *bmpData = puVar4;
  return;
LAB_001ff371:
  pbVar9 = *bmpData;
  goto LAB_001ff37e;
}

Assistant:

void CImageLoaderBMP::decompress8BitRLE(u8 *&bmpData, s32 size, s32 width, s32 height, s32 pitch) const
{
	u8 *p = bmpData;
	const u8 *pEnd = bmpData + size;
	u8 *newBmp = new u8[(width + pitch) * height];
	u8 *d = newBmp;
	const u8 *destEnd = newBmp + (width + pitch) * height;
	s32 line = 0;

	while (p < pEnd && d < destEnd) {
		if (*p == 0) {
			++p;
			CHECKP(1);

			switch (*p) {
			case 0: // end of line
				++p;
				++line;
				d = newBmp + (line * (width + pitch));
				break;
			case 1: // end of bmp
				goto exit;
			case 2:
				++p;
				CHECKP(2);
				d += (u8)*p;
				++p; // delta
				d += ((u8)*p) * (width + pitch);
				++p;
				break;
			default: {
				// absolute mode
				s32 count = (u8)*p;
				++p;
				s32 readAdditional = ((2 - (count % 2)) % 2);

				CHECKP(count);
				CHECKD(count);
				for (s32 i = 0; i < count; ++i) {
					*d = *p;
					++p;
					++d;
				}

				CHECKP(readAdditional);
				for (s32 i = 0; i < readAdditional; ++i)
					++p;
			}
			}
		} else {
			s32 count = (u8)*p;
			++p;
			CHECKP(1);
			u8 color = *p;
			++p;
			CHECKD(count);
			for (s32 i = 0; i < count; ++i) {
				*d = color;
				++d;
			}
		}
	}

exit:
	delete[] bmpData;
	bmpData = newBmp;
}